

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthread.cpp
# Opt level: O1

void __thiscall QDaemonThread::~QDaemonThread(QDaemonThread *this)

{
  __pointer_type copy;
  QThreadPrivate *this_00;
  ushort *puVar1;
  long in_FS_OFFSET;
  bool bVar2;
  QString local_60;
  QMessageLogger local_48;
  QMutex *local_28;
  ulong uStack_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_QThread).super_QObject._vptr_QObject = (_func_int **)&PTR_metaObject_006ad500;
  this_00 = (QThreadPrivate *)(this->super_QThread).super_QObject.d_ptr.d;
  local_28 = &this_00->mutex;
  uStack_20 = 0xaaaaaaaaaaaaaa00;
  if ((this_00->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar2 = (local_28->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar2) {
      (local_28->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (bVar2) goto LAB_00346b48;
  }
  QBasicMutex::lockInternal(&local_28->super_QBasicMutex);
LAB_00346b48:
  uStack_20 = CONCAT71(uStack_20._1_7_,1);
  if (this_00->threadState == Finishing) {
    QThreadPrivate::wait(this_00,&local_28);
  }
  if ((this_00->threadState == Running) && (this_00->data->isAdopted == false)) {
    local_48.context.version = 2;
    local_48.context._4_8_ = 0;
    local_48.context._12_8_ = 0;
    local_48.context.function._4_4_ = 0;
    local_48.context.category = "default";
    QObject::objectName(&local_60,(QObject *)this);
    puVar1 = QString::utf16(&local_60);
    QMessageLogger::fatal
              (&local_48,"QThread: Destroyed while thread \'%ls\' is still running",puVar1);
  }
  (this_00->data->thread).super_QBasicAtomicPointer<QThread>._q_value._M_b._M_p =
       (__pointer_type)0x0;
  if ((char)uStack_20 == '\x01') {
    LOCK();
    copy = (local_28->super_QBasicMutex).d_ptr._q_value._M_b._M_p;
    (local_28->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    if (copy != (__pointer_type)0x1) {
      QBasicMutex::unlockInternalFutex(&local_28->super_QBasicMutex,copy);
    }
    uStack_20 = uStack_20 & 0xffffffffffffff00;
  }
  QObject::~QObject((QObject *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QThread::~QThread()
{
    Q_D(QThread);
    {
        QMutexLocker locker(&d->mutex);
        if (d->threadState == QThreadPrivate::Finishing)
            d->wait(locker, QDeadlineTimer::Forever);
        if (d->threadState == QThreadPrivate::Running && !d->data->isAdopted)
            qFatal("QThread: Destroyed while thread '%ls' is still running", qUtf16Printable(objectName()));

        d->data->thread.storeRelease(nullptr);
    }
}